

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordinationNumber.cpp
# Opt level: O0

void __thiscall OpenMD::CoordinationNumber::writeOutput(CoordinationNumber *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *this_00;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  StaticAnalyser *in_RDI;
  uint n;
  RealType binValue;
  Revision r;
  ofstream ofs;
  Revision *in_stack_fffffffffffffd28;
  uint local_264;
  string local_260 [32];
  string local_240 [32];
  double local_220;
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_bin);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    local_220 = 0.0;
    poVar3 = std::operator<<(local_208,"# ");
    this_00 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar3 = std::operator<<(poVar3,(string *)this_00);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_((Revision *)this_00);
    poVar3 = std::operator<<(poVar3,local_240);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_240);
    poVar3 = std::operator<<(local_208,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffd28);
    poVar3 = std::operator<<(poVar3,local_260);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_260);
    poVar3 = std::operator<<(local_208,"# selection script1: \"");
    std::operator<<(poVar3,(string *)&in_RDI[1].dumpFilename_);
    poVar3 = std::operator<<(local_208,"\"\tselection script2: \"");
    poVar3 = std::operator<<(poVar3,(string *)&in_RDI[9].info_);
    std::operator<<(poVar3,"\"\n");
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      poVar3 = std::operator<<(local_208,"# parameters: ");
      poVar3 = std::operator<<(poVar3,(string *)&in_RDI->paramString_);
      std::operator<<(poVar3,"\n");
    }
    for (local_264 = 0;
        sVar5 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)
                           &in_RDI[0x11].dumpFilename_.field_2), local_264 < sVar5;
        local_264 = local_264 + 1) {
      local_220 = (double)local_264 * *(double *)&in_RDI[0x11].dumpFilename_;
      poVar3 = (ostream *)std::ostream::operator<<(local_208,local_220);
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x11].dumpFilename_.field_2,(ulong)local_264);
      poVar3 = (ostream *)
               std::ostream::operator<<(poVar3,*pvVar6 / *(double *)&in_RDI[0x11].dumpFilename_);
      std::operator<<(poVar3,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void CoordinationNumber::writeOutput() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);

    if (ofs.is_open()) {
      Revision r;
      RealType binValue(0.0);

      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << sele1_;
      ofs << "\"\tselection script2: \"" << sele2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      for (unsigned int n = 0; n < histogram_.size(); n++) {
        binValue = n * delta_;
        ofs << binValue << "\t" << histogram_[n] / delta_ << "\n";
      }
    }
    ofs.close();
  }